

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

char * tinyexr::ReadAttribute
                 (string *name,string *ty,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data,char *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __dest;
  char *pcVar2;
  int *piVar3;
  char *extraout_RAX;
  char *extraout_RAX_00;
  undefined8 uVar4;
  undefined8 *puVar5;
  char *this;
  pointer unaff_R12;
  size_type __new_size;
  value_type vStack_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_38;
  
  if (*ptr == '\0') {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = ReadString(name,ptr);
    piVar3 = (int *)ReadString(ty,pcVar2);
    __new_size = (size_type)*piVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(data,__new_size);
    __dest = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish == __dest) {
      this = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
      puVar5 = (undefined8 *)0x0;
      pcVar2 = (char *)std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,0,0);
      piVar3 = (int *)*puVar5;
      pvStack_38 = data;
      if ((int *)puVar5[1] != piVar3) {
        if ((char)*piVar3 != '\0') {
          paVar1 = &vStack_68.name.field_2;
          do {
            vStack_68.name._M_string_length = 0;
            vStack_68.name.field_2._M_local_buf[0] = '\0';
            vStack_68.name._M_dataplus._M_p = (pointer)paVar1;
            piVar3 = (int *)ReadString(&vStack_68.name,(char *)piVar3);
            vStack_68.pixel_type = *piVar3;
            vStack_68.p_linear = (uchar)piVar3[1];
            vStack_68.x_sampling = piVar3[2];
            vStack_68.y_sampling = piVar3[3];
            std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::push_back
                      ((vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)this,
                       &vStack_68);
            pcVar2 = extraout_RAX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_68.name._M_dataplus._M_p != paVar1) {
              operator_delete(vStack_68.name._M_dataplus._M_p,
                              CONCAT71(vStack_68.name.field_2._M_allocated_capacity._1_7_,
                                       vStack_68.name.field_2._M_local_buf[0]) + 1);
              pcVar2 = extraout_RAX_00;
            }
            piVar3 = piVar3 + 4;
          } while ((char)*piVar3 != '\0');
        }
        return pcVar2;
      }
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      if (vStack_68.name._M_dataplus._M_p != unaff_R12) {
        operator_delete(vStack_68.name._M_dataplus._M_p,
                        CONCAT71(vStack_68.name.field_2._M_allocated_capacity._1_7_,
                                 vStack_68.name.field_2._M_local_buf[0]) + 1);
      }
      _Unwind_Resume(uVar4);
    }
    memcpy(__dest,piVar3 + 1,__new_size);
    pcVar2 = (char *)((long)piVar3 + __new_size + 4);
  }
  return pcVar2;
}

Assistant:

static const char *ReadAttribute(std::string *name, std::string *ty,
                                 std::vector<unsigned char> *data,
                                 const char *ptr) {
  if ((*ptr) == 0) {
    // end of attribute.
    return NULL;
  }

  const char *p = ReadString(name, ptr);

  p = ReadString(ty, p);

  int data_len;
  memcpy(&data_len, p, sizeof(int));
  p += 4;

  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), p, static_cast<size_t>(data_len));
  p += data_len;

  return p;
}